

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void AddWindowToSortedBuffer(ImVector<ImGuiWindow_*> *out_sorted_windows,ImGuiWindow *window)

{
  uint uVar1;
  ImGuiWindow *window_00;
  int iVar2;
  ImGuiWindow **__dest;
  int iVar3;
  int iVar4;
  ImGuiWindow **ppIVar5;
  ulong uVar6;
  
  iVar2 = out_sorted_windows->Size;
  if (iVar2 != out_sorted_windows->Capacity) {
    __dest = out_sorted_windows->Data;
    goto LAB_00151afc;
  }
  if (iVar2 == 0) {
    iVar3 = 8;
  }
  else {
    iVar3 = iVar2 / 2 + iVar2;
  }
  iVar4 = iVar2 + 1;
  if (iVar2 + 1 < iVar3) {
    iVar4 = iVar3;
  }
  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
  __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar4 << 3,GImAllocatorUserData);
  if (out_sorted_windows->Data == (ImGuiWindow **)0x0) {
LAB_00151ae2:
    ppIVar5 = (ImGuiWindow **)0x0;
  }
  else {
    memcpy(__dest,out_sorted_windows->Data,(long)out_sorted_windows->Size << 3);
    ppIVar5 = out_sorted_windows->Data;
    if (ppIVar5 == (ImGuiWindow **)0x0) goto LAB_00151ae2;
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
  }
  (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
  out_sorted_windows->Data = __dest;
  out_sorted_windows->Capacity = iVar4;
  iVar2 = out_sorted_windows->Size;
LAB_00151afc:
  __dest[iVar2] = window;
  out_sorted_windows->Size = out_sorted_windows->Size + 1;
  if (window->Active == true) {
    uVar1 = (window->DC).ChildWindows.Size;
    if ((int)uVar1 < 2) {
      if (uVar1 != 1) {
        return;
      }
    }
    else {
      qsort((window->DC).ChildWindows.Data,(ulong)uVar1,8,ChildWindowComparer);
    }
    uVar6 = 0;
    do {
      if ((long)(window->DC).ChildWindows.Size <= (long)uVar6) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x49a,
                      "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window_00 = (window->DC).ChildWindows.Data[uVar6];
      if (window_00->Active == true) {
        AddWindowToSortedBuffer(out_sorted_windows,window_00);
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return;
}

Assistant:

static void AddWindowToSortedBuffer(ImVector<ImGuiWindow*>* out_sorted_windows, ImGuiWindow* window)
{
    out_sorted_windows->push_back(window);
    if (window->Active)
    {
        int count = window->DC.ChildWindows.Size;
        if (count > 1)
            qsort(window->DC.ChildWindows.begin(), (size_t)count, sizeof(ImGuiWindow*), ChildWindowComparer);
        for (int i = 0; i < count; i++)
        {
            ImGuiWindow* child = window->DC.ChildWindows[i];
            if (child->Active)
                AddWindowToSortedBuffer(out_sorted_windows, child);
        }
    }
}